

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Instance * parse(Instance *__return_storage_ptr__,char *filepath)

{
  char *filepath_local;
  
  parse_impl(__return_storage_ptr__,filepath,PARSING_FILE_EXT_AUTODETECT);
  return __return_storage_ptr__;
}

Assistant:

Instance parse(const char *filepath) {
    return parse_impl(filepath, PARSING_FILE_EXT_AUTODETECT);
}